

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

void defilter_avg3(size_t rowbytes,uchar *row,uchar *prev)

{
  undefined4 uVar1;
  undefined3 uVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  char cVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  char cVar12;
  byte bVar13;
  char cVar14;
  byte bVar15;
  char cVar16;
  byte bVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  byte bVar33;
  char cVar34;
  byte bVar35;
  
  if (rowbytes < 4) {
    bVar5 = 0;
    bVar7 = 0;
    bVar9 = 0;
    bVar11 = 0;
    bVar13 = 0;
    bVar15 = 0;
    bVar17 = 0;
    bVar19 = 0;
    bVar21 = 0;
    bVar23 = 0;
    bVar25 = 0;
    bVar27 = 0;
    bVar29 = 0;
    bVar31 = 0;
    bVar33 = 0;
    bVar35 = 0;
    if (rowbytes == 0) {
      return;
    }
  }
  else {
    bVar5 = 0;
    bVar7 = 0;
    bVar9 = 0;
    bVar11 = 0;
    bVar13 = 0;
    bVar15 = 0;
    bVar17 = 0;
    bVar19 = 0;
    bVar21 = 0;
    bVar23 = 0;
    bVar25 = 0;
    bVar27 = 0;
    bVar29 = 0;
    bVar31 = 0;
    bVar33 = 0;
    bVar35 = 0;
    do {
      uVar1 = *(undefined4 *)row;
      cVar4 = pavgb(bVar5,*prev);
      cVar6 = pavgb(bVar7,prev[1]);
      cVar8 = pavgb(bVar9,prev[2]);
      cVar10 = pavgb(bVar11,prev[3]);
      cVar12 = pavgb(bVar13,0);
      cVar14 = pavgb(bVar15,0);
      cVar16 = pavgb(bVar17,0);
      cVar18 = pavgb(bVar19,0);
      cVar20 = pavgb(bVar21,0);
      cVar22 = pavgb(bVar23,0);
      cVar24 = pavgb(bVar25,0);
      cVar26 = pavgb(bVar27,0);
      cVar28 = pavgb(bVar29,0);
      cVar30 = pavgb(bVar31,0);
      cVar32 = pavgb(bVar33,0);
      cVar34 = pavgb(bVar35,0);
      bVar13 = cVar12 - (bVar13 & 1);
      bVar15 = cVar14 - (bVar15 & 1);
      bVar17 = cVar16 - (bVar17 & 1);
      bVar19 = cVar18 - (bVar19 & 1);
      bVar21 = cVar20 - (bVar21 & 1);
      bVar23 = cVar22 - (bVar23 & 1);
      bVar25 = cVar24 - (bVar25 & 1);
      bVar27 = cVar26 - (bVar27 & 1);
      bVar29 = cVar28 - (bVar29 & 1);
      bVar31 = cVar30 - (bVar31 & 1);
      bVar33 = cVar32 - (bVar33 & 1);
      bVar35 = cVar34 - (bVar35 & 1);
      bVar5 = (cVar4 - ((bVar5 ^ *prev) & 1)) + (char)uVar1;
      bVar7 = (cVar6 - ((bVar7 ^ prev[1]) & 1)) + (char)((uint)uVar1 >> 8);
      bVar9 = (cVar8 - ((bVar9 ^ prev[2]) & 1)) + (char)((uint)uVar1 >> 0x10);
      bVar11 = (cVar10 - ((bVar11 ^ prev[3]) & 1)) + (char)((uint)uVar1 >> 0x18);
      *row = bVar5;
      row[1] = bVar7;
      row[2] = bVar9;
      prev = prev + 3;
      row = row + 3;
      rowbytes = rowbytes - 3;
    } while (3 < rowbytes);
  }
  bVar3 = prev[2];
  uVar2 = *(undefined3 *)row;
  cVar4 = pavgb(bVar5,*prev);
  cVar6 = pavgb(bVar7,prev[1]);
  cVar8 = pavgb(bVar9,bVar3);
  pavgb(bVar11,0);
  pavgb(bVar13,0);
  pavgb(bVar15,0);
  pavgb(bVar17,0);
  pavgb(bVar19,0);
  pavgb(bVar21,0);
  pavgb(bVar23,0);
  pavgb(bVar25,0);
  pavgb(bVar27,0);
  pavgb(bVar29,0);
  pavgb(bVar31,0);
  pavgb(bVar33,0);
  pavgb(bVar35,0);
  *(ushort *)row =
       CONCAT11((cVar6 + (char)((uint3)uVar2 >> 8)) - ((bVar7 ^ prev[1]) & 1),
                (cVar4 + (char)uVar2) - ((bVar5 ^ *prev) & 1));
  row[2] = (cVar8 + (char)((uint3)uVar2 >> 0x10)) - ((bVar9 ^ bVar3) & 1);
  return;
}

Assistant:

static void defilter_avg3(size_t rowbytes, unsigned char *row, const unsigned char *prev)
{
    /* The Avg filter predicts each pixel as the (truncated) average of a and b.
     * There's no pixel to the left of the first pixel.  Luckily, it's
     * predicted to be half of the pixel above it.  So again, this works
     * perfectly with our loop if we make sure a starts at zero.
     */

    size_t rb = rowbytes;

    const __m128i zero = _mm_setzero_si128();

    __m128i b;
    __m128i a, d = zero;

    while(rb >= 4)
    {
        __m128i avg;
               b = load4(prev);
        a = d; d = load4(row );

        /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
        avg = _mm_avg_epu8(a,b);
        /* ...but we can fix it up by subtracting off 1 if it rounded up. */
        avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a, b),
                                            _mm_set1_epi8(1)));
        d = _mm_add_epi8(d, avg);
        store3(row, d);

        prev += 3;
        row  += 3;
        rb   -= 3;
    }

    if(rb > 0)
    {
        __m128i avg;
               b = load3(prev);
        a = d; d = load3(row );

        /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
        avg = _mm_avg_epu8(a, b);
        /* ...but we can fix it up by subtracting off 1 if it rounded up. */
        avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a, b),
                                            _mm_set1_epi8(1)));

        d = _mm_add_epi8(d, avg);
        store3(row, d);
    }
}